

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

void __thiscall
Variable_invalidVariableName_Test::~Variable_invalidVariableName_Test
          (Variable_invalidVariableName_Test *this)

{
  Variable_invalidVariableName_Test *this_local;
  
  ~Variable_invalidVariableName_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Variable, invalidVariableName)
{
    const std::string in = "invalid name";
    const std::string e = in;
    libcellml::VariablePtr v = libcellml::Variable::create();
    v->setName(in);
    const std::string a = v->name();
    EXPECT_EQ(e, a);
}